

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended-kalman-filter.cpp
# Opt level: O2

Amatrix * __thiscall
stateObservation::ExtendedKalmanFilter::getAMatrixFD
          (Amatrix *__return_storage_ptr__,ExtendedKalmanFilter *this,StateVector *dx)

{
  IndexedMatrix *this_00;
  StateVector *this_01;
  Amatrix *other;
  StateVector *this_02;
  double dVar1;
  Scalar SVar2;
  double *pdVar3;
  Index IVar4;
  Index IVar5;
  uint time;
  Matrix *src;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  uint i;
  ulong index;
  Amatrix local_68 [2];
  
  this_00 = &(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_;
  time = IndexedMatrix::getTime(this_00);
  KalmanFilterBase::getAmatrixZero(local_68,&this->super_KalmanFilterBase);
  pdVar3 = (this->opt).a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data;
  (this->opt).a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
  ;
  IVar4 = (this->opt).a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  IVar5 = (this->opt).a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->opt).a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
  ;
  (this->opt).a_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
  ;
  local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       pdVar3;
  local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       IVar4;
  local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       IVar5;
  free(pdVar3);
  (*(this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
    [0x35])(local_68,this,(ulong)(time + 1));
  pdVar3 = (this->opt).xbar_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  (this->opt).xbar_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data;
  IVar4 = (this->opt).xbar_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  (this->opt).xbar_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows;
  local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       pdVar3;
  local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       IVar4;
  free(pdVar3);
  IndexedMatrix::operator()(local_68,this_00);
  this_01 = &(this->opt).x_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (this_01,local_68);
  free(local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  if ((this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.p_ != 0) {
    if (this->directInputStateProcessFeedthrough_ == true) {
      src = IndexedMatrixArray::operator[]
                      (&(this->super_KalmanFilterBase).super_ZeroDelayObserver.u_,time);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (&(this->opt).u_,src);
    }
    else {
      (*(this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
        [0x1a])(local_68,this);
      pdVar3 = (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           = local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
      IVar4 = (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           = local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
      local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           = pdVar3;
      local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
           = IVar4;
      free(pdVar3);
    }
  }
  other = &(this->opt).a_;
  this_02 = &(this->opt).xp_;
  for (index = 0;
      index < (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_;
      index = index + 1) {
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)dx,index);
    dVar1 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,index)
    ;
    *pSVar7 = dVar1 + *pSVar7;
    (*this->f_->_vptr_DynamicalSystemFunctorBase[2])
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_68,this->f_,
               this_01,&this->opt,(ulong)time);
    pdVar3 = (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
    IVar4 = (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
    local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         pdVar3;
    local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         IVar4;
    free(pdVar3);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_02,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->opt).xbar_);
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)dx,index);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_02,pdVar6);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_68,other,index)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_68,this_02);
    IndexedMatrix::operator()((Matrix *)local_68,this_00);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_68,
                        index,0);
    SVar2 = *pSVar8;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,index)
    ;
    *pSVar7 = SVar2;
    free(local_68[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,
             (DenseStorage<double,__1,__1,__1,_0> *)other);
  return __return_storage_ptr__;
}

Assistant:

KalmanFilterBase::Amatrix// ExtendedKalmanFilter<n,m,p>::Amatrix does not work
    ExtendedKalmanFilter::getAMatrixFD(const ObserverBase::StateVector
                                       &dx)
    {
        unsigned k=this->x_.getTime();
        opt.a_=getAmatrixZero();
        opt.xbar_=prediction_(k+1);
        opt.x_=this->x_();

        if (p_>0)
        {
            if (directInputStateProcessFeedthrough_)
                opt.u_=this->u_[k];
            else
                opt.u_=inputVectorZero();
        }

        for (unsigned i=0;i<n_;++i)
        {
            opt.x_[i]+=dx[i];
            opt.xp_=f_->stateDynamics(opt.x_,opt.u_,k);

            opt.xp_-=opt.xbar_;
            opt.xp_/=dx[i];

            opt.a_.col(i)=opt.xp_;
            opt.x_[i]=this->x_()(i,0);
        }

        return opt.a_;
    }